

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
makePointer(wasm::Expression*,wasm::Address_(void *this,Expression *ptr,Address offset)

{
  size_t sVar1;
  Ref this_00;
  Value *this_01;
  Ref RVar2;
  undefined1 *__ptr;
  Ref in_R8;
  undefined1 auVar3 [16];
  IString nextResult;
  IString op;
  
  nextResult.str._M_str = DAT_00da8850;
  nextResult.str._M_len = EXPRESSION_RESULT;
  this_00 = visit(wasm::Expression*,wasm::IString_(this,ptr,nextResult);
  sVar1 = DAT_00da8c00;
  RVar2.inst = cashew::PLUS.inst;
  if (offset.addr != 0) {
    auVar3._8_4_ = (int)(offset.addr >> 0x20);
    auVar3._0_8_ = offset.addr;
    auVar3._12_4_ = 0x45300000;
    __ptr = &DAT_00000018;
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    this_01->type = Null;
    cashew::Value::free(this_01,__ptr);
    this_01->type = Number;
    (this_01->field_1).num =
         (auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)offset.addr) - 4503599627370496.0);
    op.str._M_str = (char *)this_01;
    op.str._M_len = sVar1;
    RVar2 = cashew::ValueBuilder::makeBinary(this_00.inst,RVar2,op,in_R8);
    RVar2 = makeJsCoercion(RVar2,JS_INT);
    return (Ref)RVar2.inst;
  }
  return (Ref)this_00.inst;
}

Assistant:

Ref makePointer(Expression* ptr, Address offset) {
      auto ret = visit(ptr, EXPRESSION_RESULT);
      if (offset) {
        ret = makeJsCoercion(
          ValueBuilder::makeBinary(ret, PLUS, ValueBuilder::makeNum(offset)),
          JS_INT);
      }
      return ret;
    }